

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_database_size.cpp
# Opt level: O1

void __thiscall duckdb::PragmaDatabaseSizeData::PragmaDatabaseSizeData(PragmaDatabaseSizeData *this)

{
  LogicalType LStack_48;
  LogicalType local_30;
  
  (this->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__PragmaDatabaseSizeData_019b3ab8;
  this->index = 0;
  (this->databases).
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->databases).
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->databases).
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_30,SQLNULL);
  Value::Value(&this->memory_usage,&local_30);
  LogicalType::~LogicalType(&local_30);
  LogicalType::LogicalType(&LStack_48,SQLNULL);
  Value::Value(&this->memory_limit,&LStack_48);
  LogicalType::~LogicalType(&LStack_48);
  return;
}

Assistant:

PragmaDatabaseSizeData() : index(0) {
	}